

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall duckdb::BaseAppender::FlushChunk(BaseAppender *this)

{
  pointer pCVar1;
  
  if ((this->chunk).count != 0) {
    pCVar1 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&this->collection);
    ColumnDataCollection::Append(pCVar1,&this->chunk);
    DataChunk::Reset(&this->chunk);
    pCVar1 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&this->collection);
    if (this->flush_count <= pCVar1->count) {
      Flush(this);
      return;
    }
  }
  return;
}

Assistant:

void BaseAppender::FlushChunk() {
	if (chunk.size() == 0) {
		return;
	}
	collection->Append(chunk);
	chunk.Reset();
	if (collection->Count() >= flush_count) {
		Flush();
	}
}